

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O1

int XUtf8Toupper(int ucs)

{
  int iVar1;
  unsigned_short *puVar2;
  long lVar3;
  int ucs_00;
  
  if (XUtf8Toupper::table == (unsigned_short *)0x0) {
    puVar2 = (unsigned_short *)malloc(0x20000);
    lVar3 = 0;
    XUtf8Toupper::table = puVar2;
    do {
      puVar2[lVar3] = (unsigned_short)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10000);
    ucs_00 = 0;
    do {
      iVar1 = XUtf8Tolower(ucs_00);
      if (ucs_00 != iVar1) {
        puVar2[iVar1] = (unsigned_short)ucs_00;
      }
      ucs_00 = ucs_00 + 1;
    } while (ucs_00 != 0x10000);
  }
  if ((uint)ucs < 0x10000) {
    ucs = (int)XUtf8Toupper::table[(uint)ucs];
  }
  return ucs;
}

Assistant:

int 
XUtf8Toupper(int ucs) {
  int i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(sizeof(unsigned short) * 0x10000);
    for (i = 0; i < 0x10000; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < 0x10000; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= 0x10000 || ucs < 0) return ucs;
  return table[ucs];
}